

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O2

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,hiberlite::bean_ptr<B>>
               (AVisitor<hiberlite::KillChildren> *ar,
               vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_> *v,
               uint param_3)

{
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  body;
  allocator local_f1;
  string local_f0;
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  local_d0;
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  local_88;
  stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>
  local_40;
  
  std::__cxx11::string::string((string *)&local_f0,"items",&local_f1);
  local_40.xx.super_shared_res<hiberlite::real_bean<B>_>.res =
       (shared_cnt_obj_pair<hiberlite::real_bean<B>_> *)0x0;
  local_40.xx.super_shared_res<hiberlite::real_bean<B>_>._vptr_shared_res =
       (_func_int **)&PTR__shared_res_001bb460;
  local_40.it._M_current =
       (v->super__Vector_base<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  local_40.ct = v;
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  ::collection_nvp(&local_88,&local_f0,&local_40);
  shared_res<hiberlite::real_bean<B>_>::~shared_res
            (&local_40.xx.super_shared_res<hiberlite::real_bean<B>_>);
  std::__cxx11::string::~string((string *)&local_f0);
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  ::collection_nvp(&local_d0,&local_88);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_d0);
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  ::~collection_nvp(&local_d0);
  collection_nvp<hiberlite::bean_ptr<B>,_hiberlite::stl_stream_adapter<hiberlite::bean_ptr<B>,_std::vector<hiberlite::bean_ptr<B>,_std::allocator<hiberlite::bean_ptr<B>_>_>_>_>
  ::~collection_nvp(&local_88);
  return;
}

Assistant:

void hibernate(A& ar, std::vector<E>& v, const unsigned int)
{
	collection_nvp<E,stl_stream_adapter<E,std::vector<E> > > body( "items", stl_stream_adapter<E,std::vector<E> >(v) );
	ar & body;
}